

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::TryFinishConcurrentCollect<(Memory::CollectionFlags)3221524480>(Recycler *this)

{
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 *in_FS_OFFSET;
  
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x122b,"(this->CollectionInProgress())","this->CollectionInProgress()");
    if (!bVar4) goto LAB_0028491e;
    *puVar2 = 0;
  }
  psVar1 = &(this->collectionStats).finishCollectTryCount;
  *psVar1 = *psVar1 + 1;
  SetupPostCollectionFlags<(Memory::CollectionFlags)3221524480>(this);
  if (((this->enableConcurrentMark == false) && (this->enableParallelMark == false)) &&
     (this->enableConcurrentSweep == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1233,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
    if (!bVar4) goto LAB_0028491e;
    *puVar2 = 0;
  }
  if ((((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) &&
     (this->isCollectionDisabled == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1234,"(IsConcurrentState() || IsCollectionDisabled())",
                       "IsConcurrentState() || IsCollectionDisabled()");
    if (!bVar4) {
LAB_0028491e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  this->allowDispose = true;
  this->skipStack = false;
  this->isConcurrentGCOnIdle = false;
  iVar5 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[9])
                    (this->collectionWrapper,this,FinishConcurrentCollect,0,0xc0049000);
  return iVar5;
}

Assistant:

BOOL
Recycler::TryFinishConcurrentCollect()
{
    Assert(this->CollectionInProgress());

    RECYCLER_STATS_INC(this, finishCollectTryCount);

    SetupPostCollectionFlags<flags>();
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;

    Assert(this->IsConcurrentEnabled());
    Assert(IsConcurrentState() || IsCollectionDisabled());
    Assert(!concurrent || !forceInThread);
    if (concurrent && concurrentThread != NULL)
    {
        if (IsConcurrentExecutingState())
        {
            if (!this->priorityBoost)
            {
                uint tickCount = GetTickCount();
                if ((autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                    || (tickCount - this->tickCountStartConcurrent > RecyclerHeuristic::PriorityBoostTimeout(this->GetRecyclerFlagsTable())))
                {

    #ifdef RECYCLER_TRACE
                    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
                    {
                        Output::Print(_u("%04X> RC(%p): %s: "), this->mainThreadId, this, _u("Set priority normal"));
                        if (autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                        {
                            Output::Print(_u("AllocBytes=%d (Time=%d)\n"), autoHeap.uncollectedAllocBytes, tickCount - this->tickCountStartConcurrent);
                        }
                        else
                        {
                            Output::Print(_u("Time=%d (AllocBytes=%d\n"), tickCount - this->tickCountStartConcurrent, autoHeap.uncollectedAllocBytes);
                        }
                    }
    #endif
                    // Set it to a large number so we don't set the thread priority again
                    this->priorityBoost = true;

                    // The recycler thread hasn't come back in 5 seconds
                    // It either has a large object graph, or it is starving.
                    // Set the priority back to normal
                    SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_NORMAL);
                }
            }

            return FinishDisposeObjectsWrapped<flags>();
        }
        else if ((flags & CollectOverride_FinishConcurrentTimeout) != 0)
        {
            uint tickCount = GetTickCount();

            // If we haven't gone past the time to call finish collection,
            // simply call FinishDisposeObjects and return
            // Otherwise, actually go ahead and call FinishConcurrentCollectWrapped
            // We do this only if this is a collection that allows finish concurrent to timeout
            // If not, by default, we finish the collection
            if (tickCount <= this->tickCountNextFinishCollection)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
    }

    return FinishConcurrentCollectWrapped(flags);
}